

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UBool __thiscall
icu_63::FCDUTF16CollationIterator::previousSegment
          (FCDUTF16CollationIterator *this,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UBool UVar2;
  ushort uVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  UChar *p;
  UChar *local_30;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  local_30 = (this->super_UTF16CollationIterator).pos;
  uVar6 = 0;
  do {
    pUVar1 = local_30;
    uVar3 = Normalizer2Impl::previousFCD16(this->nfcImpl,this->rawStart,&local_30);
    uVar5 = uVar3 & 0xff;
    if ((uVar5 == 0) && (pUVar1 != (this->super_UTF16CollationIterator).pos)) {
      this->segmentStart = pUVar1;
      (this->super_UTF16CollationIterator).start = pUVar1;
LAB_002331fa:
      iVar4 = 2;
    }
    else if ((uVar5 == 0) ||
            ((((char)uVar6 == '\0' || uVar5 <= uVar6 && (uVar3 != 0x8184)) && (uVar3 != 0x8182)))) {
      uVar6 = uVar3 >> 8;
      if ((uVar3 < 0x100) || (iVar4 = 0, local_30 == this->rawStart)) {
        this->segmentStart = local_30;
        (this->super_UTF16CollationIterator).start = local_30;
        goto LAB_002331fa;
      }
    }
    else {
      do {
        pUVar1 = local_30;
        if ((uVar3 < 0x100) || (local_30 == this->rawStart)) break;
        uVar3 = Normalizer2Impl::previousFCD16(this->nfcImpl,this->rawStart,&local_30);
      } while (uVar3 != 0);
      UVar2 = normalize(this,pUVar1,(this->super_UTF16CollationIterator).pos,errorCode);
      if (UVar2 != '\0') {
        (this->super_UTF16CollationIterator).pos = (this->super_UTF16CollationIterator).limit;
        goto LAB_002331fa;
      }
      iVar4 = 1;
    }
    if (iVar4 != 0) {
      if (iVar4 == 2) {
        this->checkDir = '\0';
      }
      return iVar4 == 2;
    }
  } while( true );
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }